

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseTraitImpl
          (Parser *this,bool *err,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *impltraits)

{
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> uVar1;
  bool bVar2;
  type pEVar3;
  tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> tVar4;
  bool local_71;
  __normal_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_68;
  const_iterator local_60;
  undefined1 local_58 [24];
  const_iterator local_40;
  undefined1 local_38 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> rhs;
  BiOpExpr *biopexpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *impltraits_local;
  bool *err_local;
  Parser *this_local;
  
  expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)impltraits;
  parseExpression((Parser *)&biopexpr,(Precedence)this);
  while( true ) {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&biopexpr);
    local_71 = false;
    if (bVar2) {
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &biopexpr);
      local_71 = isBiOpExpr(pEVar3,TOK_OP_COMMA);
    }
    if (local_71 == false) break;
    pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr)
    ;
    tVar4.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
         __dynamic_cast(pEVar3,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
    if (tVar4.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl ==
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      __cxa_bad_cast();
    }
    rhs._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         tVar4.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    BiOpExpr::getRightPtr((BiOpExpr *)local_38);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
    uVar1 = expr;
    if (bVar2) {
      local_58._16_8_ =
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::begin((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)expr._M_t.
                      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
                      .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
      ::__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>*>
                ((__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  *)&local_40,
                 (__normal_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                  *)(local_58 + 0x10));
      local_58._8_8_ =
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::insert((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     *)uVar1._M_t.
                       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl,local_40,
                    (value_type *)local_38);
    }
    BiOpExpr::getLeftPtr((BiOpExpr *)local_58);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_38);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&biopexpr);
  uVar1 = expr;
  if (bVar2) {
    local_68._M_current =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
         std::
         vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::begin((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)expr._M_t.
                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
    ::__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>*>
              ((__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                *)&local_60,&local_68);
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::insert((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
              *)uVar1._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl,local_60,
             (value_type *)&biopexpr);
  }
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr);
  return;
}

Assistant:

void Parser::parseTraitImpl(bool &err,
    std::vector<std::unique_ptr<Expr>> &impltraits) noexcept {
  // inherit traits
  std::unique_ptr<Expr> expr(parseExpression());
  // comma separated list of expressions
  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    auto rhs = biopexpr.getRightPtr();
    if (rhs)
      impltraits.insert(impltraits.begin(), std::move(rhs));
    // next iterator step
    expr = biopexpr.getLeftPtr();
  }

  if (expr)
    impltraits.insert(impltraits.begin(), std::move(expr));
}